

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

CollationKey * __thiscall
icu_63::RuleBasedCollator::getCollationKey
          (RuleBasedCollator *this,UChar *s,int32_t length,CollationKey *key,UErrorCode *errorCode)

{
  CollationKey *pCVar1;
  bool bVar2;
  CollationKeyByteSink sink;
  SortKeyByteSink local_50;
  CollationKey *local_30;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (length == 0 || s != (UChar *)0x0) {
      CollationKey::reset(key);
      bVar2 = key->fFlagAndLength < 0;
      local_50.buffer_ = (char *)&key->fUnion;
      if (bVar2) {
        local_50.buffer_ = (char *)(key->fUnion).fFields.fBytes;
      }
      local_50.capacity_ = 0x20;
      if (bVar2) {
        local_50.capacity_ = (key->fUnion).fFields.fCapacity;
      }
      local_50.appended_ = 0;
      local_50.ignore_ = 0;
      local_50.super_ByteSink._vptr_ByteSink = (_func_int **)&PTR__CollationKeyByteSink_004760a8;
      local_30 = key;
      writeSortKey(this,s,length,&local_50,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (key->fHashCode == 2) {
          *errorCode = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          CollationKey::setLength(key,local_50.appended_);
        }
      }
      else {
        CollationKey::setToBogus(key);
      }
      SortKeyByteSink::~SortKeyByteSink(&local_50);
      return key;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  pCVar1 = CollationKey::setToBogus(key);
  return pCVar1;
}

Assistant:

CollationKey &
RuleBasedCollator::getCollationKey(const UChar *s, int32_t length, CollationKey& key,
                                   UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return key.setToBogus();
    }
    if(s == NULL && length != 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return key.setToBogus();
    }
    key.reset();  // resets the "bogus" state
    CollationKeyByteSink sink(key);
    writeSortKey(s, length, sink, errorCode);
    if(U_FAILURE(errorCode)) {
        key.setToBogus();
    } else if(key.isBogus()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
    } else {
        key.setLength(sink.NumberOfBytesAppended());
    }
    return key;
}